

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

void __thiscall PruneReplayer::access_graphics_pipelines(PruneReplayer *this)

{
  bool bVar1;
  reference ppVar2;
  pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*> *pipe;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_long,_const_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>_>
  *__range1;
  PruneReplayer *this_local;
  
  __end1 = std::
           unordered_map<unsigned_long,_const_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>_>
           ::begin(&this->graphics_pipelines);
  pipe = (pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*> *)
         std::
         unordered_map<unsigned_long,_const_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>_>
         ::end(&this->graphics_pipelines);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
                         *)&pipe);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false,_false>
             ::operator*(&__end1);
    access_graphics_pipeline(this,ppVar2->first,ppVar2->second);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false,_false>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void access_graphics_pipelines()
	{
		for (auto &pipe : graphics_pipelines)
			access_graphics_pipeline(pipe.first, pipe.second);
	}